

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O0

double __thiscall
jsoncons::cbor::
basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::get_double(basic_cbor_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
             *this,error_code *ec)

{
  byte bVar1;
  uint uVar2;
  type_conflict2 tVar3;
  uint8_t *in_RDI;
  type_conflict7 tVar4;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *unaff_retaddr;
  uint8_t buf_1 [8];
  uint8_t buf [4];
  uint8_t info;
  uint8_t b;
  double val;
  undefined4 in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffd0;
  uint8_t local_21;
  double local_20;
  uint8_t *length;
  value_type *in_stack_fffffffffffffff8;
  
  local_20 = 0.0;
  length = in_RDI;
  tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::read<std::random_access_iterator_tag>
                    (unaff_retaddr,in_stack_fffffffffffffff8,(size_t)in_RDI);
  if (tVar3 == 0) {
    std::error_code::operator=(in_stack_ffffffffffffffd0,(cbor_errc)((ulong)in_RDI >> 0x20));
    in_RDI[8] = '\0';
    local_20 = 0.0;
  }
  else {
    bVar1 = get_additional_information_value(local_21);
    uVar2 = (uint)bVar1;
    if (uVar2 == 0x1a) {
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>
                        (unaff_retaddr,in_stack_fffffffffffffff8,(size_t)length);
      if (tVar3 == 4) {
        tVar4 = binary::big_to_native<float,jsoncons::detail::endian>
                          (in_RDI,CONCAT44(uVar2,in_stack_ffffffffffffffc0));
        local_20 = (double)tVar4;
      }
      else {
        std::error_code::operator=(in_stack_ffffffffffffffd0,(cbor_errc)((ulong)in_RDI >> 0x20));
        in_RDI[8] = '\0';
        local_20 = 0.0;
      }
    }
    else if (uVar2 == 0x1b) {
      tVar3 = binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::read<std::random_access_iterator_tag>
                        (unaff_retaddr,in_stack_fffffffffffffff8,(size_t)length);
      if (tVar3 == 8) {
        local_20 = binary::big_to_native<double,jsoncons::detail::endian>
                             (in_RDI,CONCAT44(uVar2,in_stack_ffffffffffffffc0));
      }
      else {
        std::error_code::operator=(in_stack_ffffffffffffffd0,(cbor_errc)((ulong)in_RDI >> 0x20));
        in_RDI[8] = '\0';
        local_20 = 0.0;
      }
    }
  }
  return local_20;
}

Assistant:

double get_double(std::error_code& ec)
    {
        double val = 0;

        uint8_t b;
        if (source_.read(&b, 1) == 0)
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return 0;
        }
        uint8_t info = get_additional_information_value(b);
        switch (info)
        {
        case 0x1a: // Single-Precision Float (four-byte IEEE 754)
            {
                uint8_t buf[sizeof(float)];
                if (source_.read(buf, sizeof(float)) !=sizeof(float)) 
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<float>(buf, sizeof(buf));
                break;
            }

        case 0x1b: //  Double-Precision Float (eight-byte IEEE 754)
            {
                uint8_t buf[sizeof(double)];
                if (source_.read(buf, sizeof(double)) != sizeof(double))
                {
                    ec = cbor_errc::unexpected_eof;
                    more_ = false;
                    return 0;
                }
                val = binary::big_to_native<double>(buf, sizeof(buf));
                break;
            }
            default:
                break;
        }
        
        return val;
    }